

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::Session(Session *this)

{
  Parser *this_00;
  ConfigData *this_01;
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  IMutableContext *pIVar4;
  ostream *poVar5;
  undefined8 uVar6;
  exception_ptr local_d0 [2];
  Colour colourGuard;
  ReusableStringStream local_b0;
  Parser local_90;
  long *plVar3;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_0019e528;
  this_00 = &this->m_cli;
  clara::detail::Parser::Parser(this_00);
  this_01 = &this->m_configData;
  ConfigData::ConfigData(this_01);
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_startupExceptions = false;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream(&local_b0);
    _colourGuard = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp"
    ;
    Catch::operator<<(local_b0.m_oss,(SourceLineInfo *)&colourGuard);
    std::operator<<(local_b0.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_b0.m_oss,"Only one instance of Catch::Session can ever be used");
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_90);
  }
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar2);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  if (*plVar3 != plVar3[1]) {
    config(this);
    pIVar4 = getCurrentMutableContext();
    std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Catch::Config,void>
              ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&local_90,
               &(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
    (*(pIVar4->super_IContext)._vptr_IContext[7])(pIVar4,&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90.m_exeName);
    this->m_startupExceptions = true;
    _colourGuard = (char *)((ulong)_colourGuard & 0xffffffffffffff00);
    Colour::use(Red);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Errors occurred during startup!");
    std::operator<<(poVar5,'\n');
    if ((exception_ptr *)*plVar3 != (exception_ptr *)plVar3[1]) {
      clara::std::__exception_ptr::exception_ptr::exception_ptr(local_d0,(exception_ptr *)*plVar3);
      uVar6 = std::rethrow_exception((exception_ptr)local_d0);
      Colour::~Colour(&colourGuard);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ConfigData::~ConfigData(this_01);
      clara::detail::Parser::~Parser(this_00);
      _Unwind_Resume(uVar6);
    }
    Colour::~Colour(&colourGuard);
  }
  Session()::alreadyInstantiated = '\x01';
  makeCommandLineParser(&local_90,this_01);
  clara::detail::Parser::operator=(this_00,&local_90);
  clara::detail::Parser::~Parser(&local_90);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }